

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiMeshMorphAnim **_dest,aiMeshMorphAnim *src)

{
  undefined8 *puVar1;
  aiMeshMorphKey *paVar2;
  aiMeshMorphAnim *__dest;
  ulong *puVar3;
  aiMeshMorphKey *__dest_00;
  void *pvVar4;
  size_t sVar5;
  size_t __n;
  ulong uVar6;
  long lVar7;
  
  if (src != (aiMeshMorphAnim *)0x0 && _dest != (aiMeshMorphAnim **)0x0) {
    __dest = (aiMeshMorphAnim *)operator_new(0x410);
    *_dest = __dest;
    memcpy(__dest,src,0x410);
    paVar2 = __dest->mKeys;
    uVar6 = (ulong)__dest->mNumKeys;
    if (paVar2 != (aiMeshMorphKey *)0x0) {
      __n = uVar6 * 0x20;
      puVar3 = (ulong *)operator_new__(__n + 8);
      *puVar3 = uVar6;
      __dest_00 = (aiMeshMorphKey *)(puVar3 + 1);
      if (uVar6 != 0) {
        sVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)puVar3 + sVar5 + 0x14);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&__dest_00->mTime + sVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          sVar5 = sVar5 + 0x20;
        } while (__n != sVar5);
      }
      __dest->mKeys = __dest_00;
      memcpy(__dest_00,paVar2,__n);
    }
    if (uVar6 != 0) {
      lVar7 = 0;
      uVar6 = 0;
      do {
        paVar2 = __dest->mKeys;
        pvVar4 = operator_new__((ulong)*(uint *)((long)&paVar2->mNumValuesAndWeights + lVar7) << 2);
        *(void **)((long)&paVar2->mValues + lVar7) = pvVar4;
        paVar2 = __dest->mKeys;
        pvVar4 = operator_new__((ulong)*(uint *)((long)&paVar2->mNumValuesAndWeights + lVar7) << 3);
        *(void **)((long)&paVar2->mWeights + lVar7) = pvVar4;
        memcpy(*(void **)((long)&__dest->mKeys->mValues + lVar7),
               *(void **)((long)&src->mKeys->mValues + lVar7),
               (ulong)*(uint *)((long)&__dest->mKeys->mNumValuesAndWeights + lVar7) << 2);
        memcpy(*(void **)((long)&__dest->mKeys->mWeights + lVar7),
               *(void **)((long)&src->mKeys->mWeights + lVar7),
               (ulong)*(uint *)((long)&__dest->mKeys->mNumValuesAndWeights + lVar7) << 3);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar6 < __dest->mNumKeys);
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMeshMorphAnim** _dest, const aiMeshMorphAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMeshMorphAnim* dest = *_dest = new aiMeshMorphAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMeshMorphAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mKeys, dest->mNumKeys );
    for (ai_uint i = 0; i < dest->mNumKeys;++i) {
        dest->mKeys[i].mValues = new unsigned int[dest->mKeys[i].mNumValuesAndWeights];
        dest->mKeys[i].mWeights = new double[dest->mKeys[i].mNumValuesAndWeights];
        ::memcpy(dest->mKeys[i].mValues, src->mKeys[i].mValues, dest->mKeys[i].mNumValuesAndWeights * sizeof(unsigned int));
        ::memcpy(dest->mKeys[i].mWeights, src->mKeys[i].mWeights, dest->mKeys[i].mNumValuesAndWeights * sizeof(double));
    }
}